

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Parser.h
# Opt level: O0

bool __thiscall Assimp::MD5::MD5Parser::SkipLine(MD5Parser *this)

{
  bool bVar1;
  MD5Parser *this_local;
  
  bVar1 = SkipLine(this,this->buffer,&this->buffer);
  return bVar1;
}

Assistant:

bool SkipLine( )
    {
        return SkipLine(buffer,(const char**)&buffer);
    }